

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

ptls_key_schedule_t *
key_schedule_new(ptls_cipher_suite_t *preferred,ptls_cipher_suite_t **offered,
                char *hkdf_label_prefix)

{
  ptls_cipher_suite_t *ppVar1;
  void *__dest;
  long lVar2;
  size_t local_d0;
  size_t j_1;
  size_t i_1;
  ptls_cipher_suite_t *cs_1;
  ptls_key_schedule_t *local_b0;
  size_t local_50;
  size_t j;
  size_t i;
  ptls_cipher_suite_t *cs;
  size_t num_hashes;
  ptls_key_schedule_t *sched;
  char *hkdf_label_prefix_local;
  ptls_cipher_suite_t **offered_local;
  ptls_cipher_suite_t *preferred_local;
  
  sched = (ptls_key_schedule_t *)hkdf_label_prefix;
  if (hkdf_label_prefix == (char *)0x0) {
    sched = (ptls_key_schedule_t *)anon_var_dwarf_5b82;
  }
  cs = (ptls_cipher_suite_t *)(ulong)(preferred != (ptls_cipher_suite_t *)0x0);
  i = (size_t)preferred;
  if (offered != (ptls_cipher_suite_t **)0x0) {
    for (j = 0; ppVar1 = offered[j], ppVar1 != (ptls_cipher_suite_t *)0x0; j = j + 1) {
      if ((preferred == (ptls_cipher_suite_t *)0x0) || (ppVar1->hash != preferred->hash)) {
        local_50 = 0;
        while ((local_50 != j && (ppVar1->hash != offered[local_50]->hash))) {
          local_50 = local_50 + 1;
        }
        if (local_50 == j) {
          cs = (ptls_cipher_suite_t *)((long)&cs->id + 1);
        }
      }
    }
    i = 0;
  }
  hkdf_label_prefix_local = (char *)offered;
  offered_local = (ptls_cipher_suite_t **)preferred;
  __dest = malloc((long)cs * 0x10 + 0x58);
  if (__dest == (void *)0x0) {
    preferred_local = (ptls_cipher_suite_t *)0x0;
  }
  else {
    num_hashes = (size_t)__dest;
    memset(&cs_1,0,0x68);
    local_b0 = sched;
    memcpy(__dest,&cs_1,0x68);
    if (offered_local != (ptls_cipher_suite_t **)0x0) {
      *(ptls_cipher_suite_t **)(num_hashes + 0x58 + *(long *)(num_hashes + 0x50) * 0x10) =
           offered_local[2];
      lVar2 = (*(code *)offered_local[2]->hash)();
      *(long *)(num_hashes + *(long *)(num_hashes + 0x50) * 0x10 + 0x60) = lVar2;
      if (lVar2 == 0) {
LAB_0011bb09:
        key_schedule_free((ptls_key_schedule_t *)num_hashes);
        return (ptls_key_schedule_t *)0x0;
      }
      *(long *)(num_hashes + 0x50) = *(long *)(num_hashes + 0x50) + 1;
    }
    if (hkdf_label_prefix_local != (char *)0x0) {
      for (j_1 = 0; lVar2 = *(long *)(hkdf_label_prefix_local + j_1 * 8), lVar2 != 0; j_1 = j_1 + 1)
      {
        if ((offered_local == (ptls_cipher_suite_t **)0x0) ||
           (*(ptls_cipher_suite_t **)(lVar2 + 0x10) != offered_local[2])) {
          local_d0 = 0;
          while ((local_d0 != j_1 &&
                 (*(long *)(lVar2 + 0x10) !=
                  *(long *)(*(long *)(hkdf_label_prefix_local + local_d0 * 8) + 0x10)))) {
            local_d0 = local_d0 + 1;
          }
          if (local_d0 == j_1) {
            *(undefined8 *)(num_hashes + 0x58 + *(long *)(num_hashes + 0x50) * 0x10) =
                 *(undefined8 *)(lVar2 + 0x10);
            lVar2 = (**(code **)(*(long *)(lVar2 + 0x10) + 0x10))();
            *(long *)(num_hashes + *(long *)(num_hashes + 0x50) * 0x10 + 0x60) = lVar2;
            if (lVar2 == 0) goto LAB_0011bb09;
            *(long *)(num_hashes + 0x50) = *(long *)(num_hashes + 0x50) + 1;
          }
        }
      }
    }
    preferred_local = (ptls_cipher_suite_t *)num_hashes;
  }
  return (ptls_key_schedule_t *)preferred_local;
}

Assistant:

static ptls_key_schedule_t *key_schedule_new(ptls_cipher_suite_t *preferred, ptls_cipher_suite_t **offered,
                                             const char *hkdf_label_prefix)
{
#define FOREACH_HASH(block)                                                                                                        \
    do {                                                                                                                           \
        ptls_cipher_suite_t *cs;                                                                                                   \
        if ((cs = preferred) != NULL) {                                                                                            \
            block                                                                                                                  \
        }                                                                                                                          \
        if (offered != NULL) {                                                                                                     \
            size_t i, j;                                                                                                           \
            for (i = 0; (cs = offered[i]) != NULL; ++i) {                                                                          \
                if (preferred == NULL || cs->hash != preferred->hash) {                                                            \
                    for (j = 0; j != i; ++j)                                                                                       \
                        if (cs->hash == offered[j]->hash)                                                                          \
                            break;                                                                                                 \
                    if (j == i) {                                                                                                  \
                        block                                                                                                      \
                    }                                                                                                              \
                }                                                                                                                  \
            }                                                                                                                      \
        }                                                                                                                          \
    } while (0)

    ptls_key_schedule_t *sched;

    if (hkdf_label_prefix == NULL)
        hkdf_label_prefix = PTLS_HKDF_EXPAND_LABEL_PREFIX;

    { /* allocate */
        size_t num_hashes = 0;
        FOREACH_HASH({ ++num_hashes; });
        if ((sched = malloc(offsetof(ptls_key_schedule_t, hashes) + sizeof(sched->hashes[0]) * num_hashes)) == NULL)
            return NULL;
        *sched = (ptls_key_schedule_t){0, hkdf_label_prefix};
    }

    /* setup the hash algos and contexts */
    FOREACH_HASH({
        sched->hashes[sched->num_hashes].algo = cs->hash;
        if ((sched->hashes[sched->num_hashes].ctx = cs->hash->create()) == NULL)
            goto Fail;
        ++sched->num_hashes;
    });

    return sched;
Fail:
    key_schedule_free(sched);
    return NULL;

#undef FOREACH_HASH
}